

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O0

int ndn_asn1_probe_ecdsa_signature_encoding_size
              (uint8_t *raw_ecdsa_sig,uint32_t raw_ecdsa_sig_len,uint32_t *encoded_ecdsa_sig_len)

{
  uint32_t uVar1;
  uint8_t local_78 [8];
  uint8_t sig [72];
  uint32_t *encoded_ecdsa_sig_len_local;
  uint32_t raw_ecdsa_sig_len_local;
  uint8_t *raw_ecdsa_sig_local;
  
  if (raw_ecdsa_sig_len == 0x40) {
    memcpy(sig,raw_ecdsa_sig,0x40);
    uVar1 = encodeSignatureBits(local_78);
    *encoded_ecdsa_sig_len = uVar1;
    raw_ecdsa_sig_local._4_4_ = 0;
  }
  else {
    raw_ecdsa_sig_local._4_4_ = -0x84;
  }
  return raw_ecdsa_sig_local._4_4_;
}

Assistant:

int
ndn_asn1_probe_ecdsa_signature_encoding_size(const uint8_t *raw_ecdsa_sig, uint32_t raw_ecdsa_sig_len,
                                             uint32_t *encoded_ecdsa_sig_len)
{
  if (raw_ecdsa_sig_len != 64) {
    return NDN_ASN1_ECDSA_SIG_INVALID_SIZE;
  }
  uint8_t sig[72];
  memcpy(&sig[8], raw_ecdsa_sig, 64);
  *encoded_ecdsa_sig_len = (uint32_t)encodeSignatureBits(sig);
  return NDN_SUCCESS;
}